

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

istream * spvtools::utils::
          ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                    (istream *is,bool negate_value,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ulong in_RAX;
  uint uVar4;
  undefined7 in_register_00000031;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  float_val;
  float float_val_1;
  undefined8 local_28;
  
  local_28 = in_RAX & 0xffffffff00000000;
  iVar2 = (int)is;
  if ((int)CONCAT71(in_register_00000031,negate_value) != 0) {
    iVar3 = std::istream::peek();
    if ((iVar3 == 0x2d) || (iVar3 == 0x2b)) {
      local_28 = local_28 & 0xffffffff00000000;
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)is + -0x18));
      if ((iVar3 - 0x2bU & 0xfffffffd) == 0) goto LAB_00621532;
    }
  }
  local_28 = local_28 & 0xffffffff;
  std::istream::_M_extract<float>((float *)is);
  uVar4 = local_28._4_4_ + 0x80000000;
  if (!negate_value) {
    uVar4 = local_28._4_4_;
  }
  local_28 = CONCAT44(local_28._4_4_,uVar4);
  if ((((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) && ((uVar4 & 0x7fffffff) == 0)) {
    local_28 = (ulong)local_28._4_4_ << 0x20;
  }
  if ((uVar4 & 0x7fffffff) == 0x7f800000) {
    iVar3 = (uint)(byte)~negate_value * -0x80000000 + -0x800001;
    if ((int)local_28 < 0) {
      iVar3 = -0x800001;
    }
    local_28 = CONCAT44(local_28._4_4_,iVar3);
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)is + -0x18));
  }
LAB_00621532:
  HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
  ::
  castTo<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
            ((HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
              *)&local_28,value,kToZero);
  uVar1 = (value->value_).data_;
  if ((uVar1 & 0x7fff) == 0x7c00) {
    (value->value_).data_ = uVar1 & 0x8000 | 0x7bff;
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)is + -0x18));
  }
  return is;
}

Assistant:

inline std::istream&
ParseNormalFloat<FloatProxy<Float16>, HexFloatTraits<FloatProxy<Float16>>>(
    std::istream& is, bool negate_value,
    HexFloat<FloatProxy<Float16>, HexFloatTraits<FloatProxy<Float16>>>& value) {
  // First parse as a 32-bit float.
  HexFloat<FloatProxy<float>> float_val(0.0f);
  ParseNormalFloat(is, negate_value, float_val);

  // Then convert to 16-bit float, saturating at infinities, and
  // rounding toward zero.
  float_val.castTo(value, round_direction::kToZero);

  // Overflow on 16-bit behaves the same as for 32- and 64-bit: set the
  // fail bit and set the lowest or highest value.
  if (Float16::isInfinity(value.value().getAsFloat())) {
    value.set_value(value.isNegative() ? Float16::lowest() : Float16::max());
    is.setstate(std::ios_base::failbit);
  }
  return is;
}